

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  Arena *this_00;
  bool bVar1;
  CppType CVar2;
  int iVar3;
  LogMessage *pLVar4;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *elem;
  Type *pTVar5;
  undefined4 extraout_var;
  LogFinisher local_71;
  LogMessage local_70;
  Extension *extension;
  
  bVar1 = MaybeNewExtension(this,number,descriptor,&extension);
  if (bVar1) {
    extension->type = type;
    CVar2 = anon_unknown_29::cpp_type(type);
    if (CVar2 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2e7);
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_71,pLVar4);
      LogMessage::~LogMessage(&local_70);
    }
    extension->is_repeated = true;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      elem = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x18);
      (elem->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      (elem->super_RepeatedPtrFieldBase).current_size_ = 0;
      (elem->super_RepeatedPtrFieldBase).total_size_ = 0;
      (elem->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    else {
      elem = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)Arena::AllocateAligned
                          (this_00,(type_info *)
                                   &RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,0x18);
      (elem->super_RepeatedPtrFieldBase).arena_ = this_00;
      (elem->super_RepeatedPtrFieldBase).current_size_ = 0;
      (elem->super_RepeatedPtrFieldBase).total_size_ = 0;
      (elem->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      Arena::AddListNode(this_00,elem,
                         arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                        );
    }
    (extension->field_0).repeated_string_value = elem;
  }
  else {
    if (extension->is_repeated == false) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2ec);
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                         );
      LogFinisher::operator=(&local_71,pLVar4);
      LogMessage::~LogMessage(&local_70);
    }
    CVar2 = anon_unknown_29::cpp_type(extension->type);
    if (CVar2 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2ec);
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_71,pLVar4);
      LogMessage::~LogMessage(&local_70);
    }
  }
  pTVar5 = RepeatedPtrFieldBase::
           AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                     ((RepeatedPtrFieldBase *)(extension->field_0).string_value);
  if (pTVar5 == (Type *)0x0) {
    iVar3 = (*prototype->_vptr_MessageLite[4])(prototype,this->arena_);
    pTVar5 = (Type *)CONCAT44(extraout_var,iVar3);
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
              ((RepeatedPtrFieldBase *)(extension->field_0).int64_value,pTVar5);
  }
  return pTVar5;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
        Arena::CreateMessage<RepeatedPtrField<MessageLite> >(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }

  // RepeatedPtrField<MessageLite> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result = extension->repeated_message_value
      ->AddFromCleared<GenericTypeHandler<MessageLite> >();
  if (result == NULL) {
    result = prototype.New(arena_);
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}